

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O0

void VHASH_PADDED_32(void *key,int len,uint32_t seed,void *res)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  undefined4 *in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  uint64_t tagl_1;
  uint64_t tagl;
  int bytesRemaining16aligned;
  int bytesRemaining;
  int alignedLn;
  int blcCnt;
  vmac_ctx_t *in_stack_000000e8;
  uint64_t *in_stack_000000f0;
  uint in_stack_000000fc;
  uchar *in_stack_00000100;
  
  if ((in_ESI & 0xf) == 0) {
    uVar3 = vhash(in_stack_00000100,in_stack_000000fc,in_stack_000000f0,in_stack_000000e8);
    *in_RCX = (int)uVar3;
  }
  else {
    iVar1 = (int)in_ESI / 0x80;
    iVar2 = iVar1 * 0x80;
    if (iVar2 != 0) {
      vhash_update((uchar *)tagl_1,(uint)((ulong)in_RDI >> 0x20),
                   (vmac_ctx_t *)CONCAT44(in_ESI,in_EDX));
    }
    iVar1 = in_ESI + iVar1 * -0x80;
    memcpy(vhi.aligned16Buff,(void *)(in_RDI + iVar2),(long)iVar1);
    memset(vhi.aligned16Buff + iVar1,0,(long)(((iVar1 >> 4) * 0x10 + 0x10) - iVar1));
    uVar3 = vhash(in_stack_00000100,in_stack_000000fc,in_stack_000000f0,in_stack_000000e8);
    *in_RCX = (int)uVar3;
  }
  return;
}

Assistant:

void VHASH_PADDED_32(const void * key, int len, uint32_t seed, void * res)
{
	(void)seed; //unused
#ifdef __arm__
	if ((((uintptr_t)key) & 0xF) == 0) // aligned in memory
	{
#endif // __arm__
		if (len & 0xF) // size is not a multiple of 16
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;

			if (alignedLn)
				vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));
//			ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
			int bytesRemaining = len - alignedLn;
			memcpy(vhi.aligned16Buff, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
			memset(vhi.aligned16Buff + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining);

			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint32_t*)res = vhash(vhi.aligned16Buff, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			*(uint32_t*)res = vhash(vhi.aligned16Buff, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
		else // size is a multiple of 16
		{
			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint32_t*)res = vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			*(uint32_t*)res = vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
#ifdef __arm__
	}
	else // unaligned data
	{
		unsigned char * buffAligned;
		unsigned char * buff = NULL;
		{
			if ( len < VHASH_initializer::MAX_BUFF_LN )
				buffAligned = vhi.aligned16Buff;
			else
			{
				buff = new unsigned char[ len + 128 ];
				buffAligned = (unsigned char*)( ( ( ( size_t(buff) ) >> 4 ) << 4 )  + 16 );
			}
			memcpy( buffAligned, key, len );
			memset( buffAligned + len, 0, 16 );
		}


		uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
		*(uint32_t*)res = (uint32_t)vhash( (unsigned char *)buffAligned, len, &tagl, &(vhi.ctx) );
#elif (VMAC_TAG_LEN == 64)
		*(uint32_t*)res = (uint32_t)vhash( (unsigned char *)buffAligned, len, &tagl, &(vhi.ctx) );
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif


		if ( buff != NULL ) delete [] buff;
	}
#endif // __arm__
	//	vhash_abort(&(vhi.ctx));
}